

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O3

CURLcode deflate_init_writer(connectdata *conn,contenc_writer *writer)

{
  int iVar1;
  CURLcode CVar2;
  
  if (writer->downstream != (contenc_writer *)0x0) {
    writer[3].params = zalloc_cb;
    writer[4].handler = (content_encoding *)zfree_cb;
    iVar1 = inflateInit_(writer + 1,"1.2.11",0x70);
    if (iVar1 == 0) {
      *(undefined4 *)&writer->params = 1;
      CVar2 = CURLE_OK;
    }
    else {
      process_zlib_error((connectdata *)conn->data,(z_stream *)writer[3].handler);
      CVar2 = CURLE_BAD_CONTENT_ENCODING;
    }
    return CVar2;
  }
  return CURLE_WRITE_ERROR;
}

Assistant:

static CURLcode deflate_init_writer(struct connectdata *conn,
                                    contenc_writer *writer)
{
  zlib_params *zp = (zlib_params *) &writer->params;
  z_stream *z = &zp->z;     /* zlib state structure */

  if(!writer->downstream)
    return CURLE_WRITE_ERROR;

  /* Initialize zlib */
  z->zalloc = (alloc_func) zalloc_cb;
  z->zfree = (free_func) zfree_cb;

  if(inflateInit(z) != Z_OK)
    return process_zlib_error(conn, z);
  zp->zlib_init = ZLIB_INIT;
  return CURLE_OK;
}